

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_HTML.h
# Opt level: O0

HTMLElement * __thiscall
choc::html::HTMLElement::setProperty(HTMLElement *this,string *propertyName,string_view value)

{
  undefined1 in_R8B;
  string_view text;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_28;
  string *propertyName_local;
  HTMLElement *this_local;
  string_view value_local;
  
  value_local._M_len = (size_t)value._M_str;
  this_local = (HTMLElement *)value._M_len;
  local_28 = propertyName;
  propertyName_local = &this->name;
  std::operator+(&local_88,propertyName,"=\"");
  text._M_str = (char *)0x1;
  text._M_len = value_local._M_len;
  escapeHTMLString_abi_cxx11_(&local_a8,this_local,text,(bool)in_R8B);
  std::operator+(&local_68,&local_88,&local_a8);
  std::operator+(&local_48,&local_68,'\"');
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->properties,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  return this;
}

Assistant:

HTMLElement& setProperty (const std::string& propertyName, std::string_view value)
    {
        properties.push_back (propertyName + "=\"" + escapeHTMLString (value, true) + '"');
        return *this;
    }